

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O3

string * __thiscall
covenant::witness_impl::to_string_abi_cxx11_
          (string *__return_storage_ptr__,witness_impl *this,witness_t *witness,TermFactory *tfac)

{
  TerminalFactory *this_00;
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (*(long *)this == *(long *)(this + 8)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    lVar2 = *(long *)this;
    if (*(long *)(this + 8) != lVar2) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        this_00 = (TerminalFactory *)
                  (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (this_00 == (TerminalFactory *)0x0) {
          __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                        "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<covenant::TerminalFactory>::operator->() const [T = covenant::TerminalFactory]"
                       );
        }
        TerminalFactory::remap_abi_cxx11_(&local_1d8,this_00,(long)*(int *)(lVar2 + uVar4 * 4));
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        lVar2 = *(long *)this;
        bVar1 = uVar5 < (ulong)(*(long *)(this + 8) - lVar2 >> 2);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

inline string to_string(const witness_t& witness, TermFactory tfac)
    {
      if (witness.empty ()) // epsilon
        return "\"\"";

      stringstream ss;      
      for(unsigned int ii = 0; ii < witness.size(); ii++)
      {
        // ss << (char) witness[ii];
        ss << tfac->remap (witness[ii]) << " ";
      }
      return ss.str();
    }